

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.cc
# Opt level: O0

void hexdump(FILE *fp,char *msg,void *in,size_t len)

{
  ulong local_38;
  size_t i;
  uint8_t *data;
  size_t len_local;
  void *in_local;
  char *msg_local;
  FILE *fp_local;
  
  fputs(msg,(FILE *)fp);
  for (local_38 = 0; local_38 < len; local_38 = local_38 + 1) {
    fprintf((FILE *)fp,"%02x",(ulong)*(byte *)((long)in + local_38));
  }
  fputs("\n",(FILE *)fp);
  return;
}

Assistant:

void hexdump(FILE *fp, const char *msg, const void *in, size_t len) {
  const uint8_t *data = reinterpret_cast<const uint8_t*>(in);

  fputs(msg, fp);
  for (size_t i = 0; i < len; i++) {
    fprintf(fp, "%02x", data[i]);
  }
  fputs("\n", fp);
}